

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandReporter.cpp
# Opt level: O1

bool __thiscall
ApprovalTests::CommandReporter::report(CommandReporter *this,string *received,string *approved)

{
  CommandLauncher *pCVar1;
  bool bVar2;
  undefined1 uVar3;
  string local_48;
  int iVar4;
  
  bVar2 = exists(&this->cmd);
  if (bVar2) {
    FileUtils::ensureFileExists(approved);
    pCVar1 = this->l;
    assembleFullCommand(&local_48,this,received,approved);
    iVar4 = (*pCVar1->_vptr_CommandLauncher[2])(pCVar1,&local_48);
    uVar3 = (undefined1)iVar4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  else {
    uVar3 = 0;
  }
  return (bool)uVar3;
}

Assistant:

bool CommandReporter::report(std::string received, std::string approved) const
    {
        if (!exists(cmd))
        {
            return false;
        }
        FileUtils::ensureFileExists(approved);
        return l->launch(assembleFullCommand(received, approved));
    }